

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileLED.cpp
# Opt level: O0

string * __thiscall TileLED::toString_abi_cxx11_(TileLED *this)

{
  const_reference pvVar1;
  long in_RSI;
  string *in_RDI;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&OUTPUT_SYMBOL_TABLE_abi_cxx11_,(long)(*(int *)(in_RSI + 0x24) + -1));
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  return in_RDI;
}

Assistant:

string TileLED::toString() const {
    return OUTPUT_SYMBOL_TABLE[_state - 1];
}